

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O3

void writeQuotedString(ostream *os,string *str,bool forceQuotes)

{
  ostringstream oVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined7 in_register_00000011;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  ostringstream oss;
  undefined1 auStack_1d8 [12];
  undefined4 local_1cc;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (((int)CONCAT71(in_register_00000011,forceQuotes) != 0) ||
     (bVar2 = stringNeedsQuoting(str), bVar2)) {
    local_1a8 = (ostringstream)0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_1a8,1);
    local_1cc = (undefined4)CONCAT71((int7)((ulong)poVar4 >> 8),1);
  }
  else {
    local_1cc = 0;
  }
  uVar9 = (uint)str->_M_string_length;
  if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      if (str->_M_string_length <= uVar8) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                           uVar8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(&local_1a8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar5);
      }
      oVar1 = *(ostringstream *)((str->_M_dataplus)._M_p + uVar8);
      switch(oVar1) {
      case (ostringstream)0x7:
        lVar6 = 2;
        pcVar7 = "\\a";
        break;
      case (ostringstream)0x8:
        lVar6 = 2;
        pcVar7 = "\\b";
        break;
      case (ostringstream)0x9:
        lVar6 = 2;
        pcVar7 = "\\t";
        break;
      case (ostringstream)0xa:
        lVar6 = 2;
        pcVar7 = "\\n";
        break;
      case (ostringstream)0xb:
        lVar6 = 2;
        pcVar7 = "\\v";
        break;
      case (ostringstream)0xc:
        lVar6 = 2;
        pcVar7 = "\\f";
        break;
      case (ostringstream)0xd:
        lVar6 = 2;
        pcVar7 = "\\r";
        break;
      default:
        if ((byte)oVar1 == 0x5c) {
          lVar6 = 2;
          pcVar7 = "\\\\";
          break;
        }
        iVar3 = isprint((int)(char)oVar1);
        if ((oVar1 != (ostringstream)0x22) && (iVar3 != 0)) {
          lVar6 = 1;
          pcVar7 = (char *)&local_1a8;
          local_1a8 = oVar1;
          break;
        }
        std::__cxx11::ostringstream::ostringstream(&local_1a8);
        lVar6 = CONCAT71(uStack_1a7,local_1a8);
        *(uint *)((long)auStack_190 + *(long *)(lVar6 + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(lVar6 + -0x18)) & 0xffffffb5 | 0x40;
        *(undefined8 *)((long)&uStack_198 + *(long *)(lVar6 + -0x18)) = 3;
        lVar6 = *(long *)(lVar6 + -0x18);
        if (acStack_c8[lVar6 + 1] == '\0') {
          std::ios::widen((char)auStack_1d8 + (char)lVar6 + '0');
          acStack_c8[lVar6 + 1] = '\x01';
        }
        acStack_c8[lVar6] = '0';
        std::ostream::operator<<((ostream *)&local_1a8,(uint)(byte)oVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\\",1);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1c8,local_1c0);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(&local_1a8);
        std::ios_base::~ios_base(local_138);
        goto LAB_00110062;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar6);
LAB_00110062:
      uVar8 = uVar8 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar8);
  }
  if ((char)local_1cc != '\0') {
    local_1a8 = (ostringstream)0x22;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_1a8,1);
  }
  return;
}

Assistant:

void writeQuotedString(ostream & os, const string & str, bool forceQuotes) {
   if (!forceQuotes && stringNeedsQuoting(str)) forceQuotes = true;
   if (forceQuotes) os << '"';
   int len = str.length();
   for (int i = 0; i < len; i++) {
      char ch = str.at(i);
      switch (ch) {
       case '\a': os << "\\a"; break;
       case '\b': os << "\\b"; break;
       case '\f': os << "\\f"; break;
       case '\n': os << "\\n"; break;
       case '\r': os << "\\r"; break;
       case '\t': os << "\\t"; break;
       case '\v': os << "\\v"; break;
       case '\\': os << "\\\\"; break;
       default:
         if (isprint(ch) && ch != '"') {
            os << ch;
         } else {
            ostringstream oss;
            oss << oct << setw(3) << setfill('0') << (int(ch) & 0xFF);
            os << "\\" << oss.str();
         }
      }
   }
   if (forceQuotes) os << '"';
}